

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# streamfilters.h
# Opt level: O2

void __thiscall
embree::LineCommentFilter::LineCommentFilter
          (LineCommentFilter *this,FileName *fileName,string *lineComment)

{
  FileStream *this_00;
  
  Stream<int>::Stream(&this->super_Stream<int>);
  (this->super_Stream<int>).super_RefCount._vptr_RefCount =
       (_func_int **)&PTR__LineCommentFilter_002a1e38;
  this_00 = (FileStream *)::operator_new(0x270);
  FileStream::FileStream(this_00,fileName);
  (this->cin).ptr = (Stream<int> *)this_00;
  (*(this_00->super_Stream<int>).super_RefCount._vptr_RefCount[2])(this_00);
  std::__cxx11::string::string((string *)&this->lineComment,(string *)lineComment);
  return;
}

Assistant:

LineCommentFilter (const FileName& fileName, const std::string& lineComment)
      : cin(new FileStream(fileName)), lineComment(lineComment) {}